

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::ShaderCompilerOperCase::~ShaderCompilerOperCase
          (ShaderCompilerOperCase *this)

{
  ~ShaderCompilerOperCase(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

ShaderCompilerOperCase::~ShaderCompilerOperCase (void)
{
}